

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O0

HighsOptions * __thiscall HighsOptions::operator=(HighsOptions *this,HighsOptions *other)

{
  size_type sVar1;
  HighsOptions *in_RSI;
  HighsOptions *in_RDI;
  HighsOptions *in_stack_00003a80;
  
  if (in_RSI != in_RDI) {
    sVar1 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::size(&in_RDI->records);
    if ((int)sVar1 == 0) {
      initRecords(in_stack_00003a80);
    }
    HighsOptionsStruct::operator=
              (&in_RSI->super_HighsOptionsStruct,&in_RDI->super_HighsOptionsStruct);
    (in_RDI->super_HighsOptionsStruct).log_options.log_stream =
         (in_RSI->super_HighsOptionsStruct).log_options.log_stream;
    setLogOptions(in_RDI);
  }
  return in_RDI;
}

Assistant:

const HighsOptions& operator=(const HighsOptions& other) {
    if (&other != this) {
      if ((HighsInt)records.size() == 0) initRecords();
      HighsOptionsStruct::operator=(other);
      this->log_options.log_stream = other.log_options.log_stream;
      setLogOptions();
    }
    return *this;
  }